

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O1

char * __thiscall
cmCommandArgumentParserHelper::CombineUnions
          (cmCommandArgumentParserHelper *this,char *in1,char *in2)

{
  size_t sVar1;
  size_t sVar2;
  tuple<char_*,_std::default_delete<char[]>_> __dest;
  char *pcVar3;
  ulong __n;
  __array out;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_30;
  
  pcVar3 = in2;
  if ((in1 != (char *)0x0) && (pcVar3 = in1, in2 != (char *)0x0)) {
    sVar1 = strlen(in1);
    sVar2 = strlen(in2);
    __n = sVar1 + sVar2 + 1;
    __dest.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)operator_new__(__n);
    memset((void *)__dest.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl,0,__n);
    local_30._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (tuple<char_*,_std::default_delete<char[]>_>)
         (tuple<char_*,_std::default_delete<char[]>_>)
         __dest.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    strcpy((char *)__dest.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl,in1);
    strcat((char *)__dest.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl,in2);
    std::
    vector<std::unique_ptr<char[],std::default_delete<char[]>>,std::allocator<std::unique_ptr<char[],std::default_delete<char[]>>>>
    ::emplace_back<std::unique_ptr<char[],std::default_delete<char[]>>>
              ((vector<std::unique_ptr<char[],std::default_delete<char[]>>,std::allocator<std::unique_ptr<char[],std::default_delete<char[]>>>>
                *)&this->Variables,(unique_ptr<char[],_std::default_delete<char[]>_> *)&local_30);
    pcVar3 = (this->Variables).
             super__Vector_base<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
    if (local_30._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)0x0) {
      operator_delete__((void *)local_30._M_t.
                                super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                super__Head_base<0UL,_char_*,_false>._M_head_impl);
    }
  }
  return pcVar3;
}

Assistant:

const char* cmCommandArgumentParserHelper::CombineUnions(const char* in1,
                                                         const char* in2)
{
  if (!in1) {
    return in2;
  }
  if (!in2) {
    return in1;
  }
  size_t len = strlen(in1) + strlen(in2) + 1;
  auto out = cm::make_unique<char[]>(len);
  strcpy(out.get(), in1);
  strcat(out.get(), in2);
  this->Variables.push_back(std::move(out));
  return this->Variables.back().get();
}